

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall CVmFormatter::buffer_char(CVmFormatter *this,wchar_t c)

{
  wchar_t *pwVar1;
  CCharmapToLocal *this_00;
  size_t exp_len;
  size_t local_20;
  
  this_00 = this->cmap_;
  if (this->cmap_ == (CCharmapToLocal *)0x0) {
    this_00 = G_cmap_to_ui_X;
  }
  pwVar1 = CCharmapToLocal::get_expansion(this_00,c,&local_20);
  if (pwVar1 == (wchar_t *)0x0) {
    buffer_expchar(this,c);
  }
  else {
    for (; local_20 != 0; local_20 = local_20 - 1) {
      buffer_expchar(this,*pwVar1);
      pwVar1 = pwVar1 + 1;
    }
  }
  return;
}

Assistant:

void CVmFormatter::buffer_char(VMG_ wchar_t c)
{
    const wchar_t *exp;
    size_t exp_len;

    /* check for a display expansion */
    exp = (cmap_ != 0 ? cmap_ : G_cmap_to_ui)->get_expansion(c, &exp_len);
    if (exp != 0)
    {
        /* write each character of the expansion */
        for ( ; exp_len != 0 ; ++exp, --exp_len)
            buffer_expchar(vmg_ *exp);
    }
    else
    {
        /* there's no expansion - buffer the character as-is */
        buffer_expchar(vmg_ c);
    }
}